

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceFile * __thiscall cmMakefile::LinearGetSourceFileWithOutput(cmMakefile *this,string *name)

{
  bool bVar1;
  cmCustomCommand *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  long lVar4;
  pointer pbVar5;
  pointer ppcVar6;
  bool bVar7;
  string out;
  cmSourceFile *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  cmMakefile *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  ppcVar6 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (ppcVar6 !=
      (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = cmSourceFile::GetCustomCommand(*ppcVar6);
      if (pcVar2 != (cmCustomCommand *)0x0) {
        pcVar2 = cmSourceFile::GetCustomCommand(*ppcVar6);
        pvVar3 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar2);
        for (pbVar5 = (pvVar3->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            bVar7 = pbVar5 != (pvVar3->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish, bVar7;
            pbVar5 = pbVar5 + 1) {
          std::__cxx11::string::_M_assign((string *)&local_58);
          lVar4 = std::__cxx11::string::rfind
                            ((char *)&local_58,(ulong)(name->_M_dataplus)._M_p,0xffffffffffffffff);
          bVar1 = true;
          if (((lVar4 != -1) && (lVar4 == local_50 - name->_M_string_length)) &&
             ((lVar4 == 0 || (local_58[lVar4 + -1] == '/')))) {
            local_60 = *ppcVar6;
            bVar1 = false;
          }
          if (!bVar1) break;
        }
        if (bVar7) goto LAB_002dcd0d;
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             (local_38->SourceFiles).
             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_60 = (cmSourceFile *)0x0;
LAB_002dcd0d:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return local_60;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    if (expand)
      {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
      }
    else
      {
      msg << i->Value;
      }
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}